

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::InstancedGridRenderTest::iterate
          (InstancedGridRenderTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *this_00;
  TestLog *this_01;
  pointer this_02;
  bool bVar2;
  _Alloc_hider _Var3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  deUint32 err;
  RenderTarget *pRVar9;
  ShaderProgramDeclaration *pSVar10;
  pointer __dest;
  long *__dest_00;
  Surface *pSVar11;
  void *__buf;
  char *description;
  void *__buf_00;
  void *__buf_01;
  int iVar12;
  int iVar13;
  undefined4 uVar14;
  qpTestResult testResult;
  VertexAttribute *__x;
  int iVar15;
  bool bVar16;
  bool bVar17;
  deUint16 indices [6];
  deUint32 colorBuf;
  Surface surface;
  size_type __dnew;
  deUint32 offsetBuf;
  deUint32 positionBuf;
  size_type __dnew_1;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> offsets;
  GLContext ctx;
  size_type __dnew_2;
  GridProgram program;
  undefined1 local_6a8 [32];
  string local_688;
  VertexAttribute local_668;
  string local_640;
  float local_61c;
  undefined1 local_618 [8];
  pointer pVStack_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  GenericVecType local_5f8;
  undefined4 uStack_5f4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8;
  Surface local_5d8;
  FragmentSource local_5c0;
  string local_5a0;
  string local_580;
  uint local_55c;
  uint local_558;
  uint local_554;
  uint local_550;
  float local_54c;
  long *local_548;
  long local_540;
  long local_538 [2];
  long local_528;
  FragmentOutput local_51c;
  LogImage local_518;
  VertexToFragmentVarying local_480;
  GLContext local_478;
  undefined1 local_308 [12];
  int iStack_2fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  undefined4 uStack_2e8;
  float fStack_2e4;
  pointer local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  float local_2c8;
  undefined8 local_2c4;
  int local_2bc;
  float local_2b8;
  float local_2b4;
  pointer local_2b0;
  ios_base local_290 [264];
  ShaderProgram local_188;
  
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar12 = pRVar9->m_width;
  if (0x3ff < iVar12) {
    iVar12 = 0x400;
  }
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar13 = 0x400;
  if (pRVar9->m_height < 0x400) {
    iVar13 = pRVar9->m_height;
  }
  local_308._0_8_ = (pointer)0x0;
  stack0xfffffffffffffd00 = (pointer)CONCAT44(iVar13,iVar12);
  sglr::GLContext::GLContext
            (&local_478,((this->super_TestCase).m_context)->m_renderCtx,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,3,
             (IVec4 *)local_308);
  tcu::Surface::Surface(&local_5d8,iVar12,iVar13);
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)local_308);
  local_6a8._0_8_ = local_6a8 + 0x10;
  local_6a8._16_8_ = 0x697469736f705f61;
  local_6a8._24_2_ = 0x6e6f;
  local_6a8._8_8_ = 10;
  local_6a8[0x1a] = '\0';
  local_518.m_name._M_dataplus._M_p = (pointer)&local_518.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_518);
  local_518.m_description._M_dataplus._M_p._0_4_ = 0;
  pSVar10 = sglr::pdec::ShaderProgramDeclaration::operator<<
                      ((ShaderProgramDeclaration *)local_308,(VertexAttribute *)&local_518);
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  local_688.field_2._M_allocated_capacity = 0x74657366666f5f61;
  local_688._M_string_length = 8;
  local_688.field_2._M_local_buf[8] = '\0';
  local_618 = (undefined1  [8])&local_608;
  std::__cxx11::string::_M_construct<char*>((string *)local_618);
  local_5f8 = GENERICVECTYPE_FLOAT;
  pSVar10 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar10,(VertexAttribute *)local_618);
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  local_580.field_2._M_allocated_capacity._0_4_ = 0x6f635f61;
  local_580.field_2._M_allocated_capacity._4_2_ = 0x6f6c;
  local_580.field_2._M_local_buf[6] = 'r';
  local_580._M_string_length = 7;
  local_580.field_2._M_local_buf[7] = '\0';
  local_668.name._M_dataplus._M_p = (pointer)&local_668.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_668);
  local_668.type = GENERICVECTYPE_FLOAT;
  pSVar10 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar10,&local_668);
  local_480.type = GENERICVECTYPE_FLOAT;
  local_480.flatshade = false;
  pSVar10 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar10,&local_480);
  local_51c.type = GENERICVECTYPE_FLOAT;
  pSVar10 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar10,&local_51c);
  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
  local_5c0.source._M_dataplus._M_p = (pointer)0xc1;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_640,(ulong)&local_5c0);
  _Var3._M_p = local_5c0.source._M_dataplus._M_p;
  local_640.field_2._M_allocated_capacity = (size_type)local_5c0.source._M_dataplus._M_p;
  local_640._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_offset;\nin highp vec4 a_color;\nout mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_Position = a_position + a_offset;\n\tv_color = a_color;\n}\n"
         ,0xc1);
  local_640._M_string_length = (size_type)_Var3._M_p;
  __dest[_Var3._M_p] = '\0';
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5a0,local_640._M_dataplus._M_p,_Var3._M_p + local_640._M_dataplus._M_p
            );
  pSVar10 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar10,(VertexSource *)&local_5a0);
  local_528 = 0x8e;
  local_548 = local_538;
  __dest_00 = (long *)std::__cxx11::string::_M_create((ulong *)&local_548,(ulong)&local_528);
  lVar5 = local_528;
  local_538[0] = local_528;
  local_548 = __dest_00;
  memcpy(__dest_00,
         "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nin mediump vec4 v_color;\nvoid main(void)\n{\n\tdEQP_FragColor = v_color;\n}\n"
         ,0x8e);
  local_540 = lVar5;
  *(undefined1 *)((long)__dest_00 + lVar5) = 0;
  paVar1 = &local_5c0.source.field_2;
  local_5c0.source._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_5c0,local_548,lVar5 + (long)local_548);
  pSVar10 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar10,&local_5c0);
  sglr::ShaderProgram::ShaderProgram(&local_188,pSVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0.source._M_dataplus._M_p != paVar1) {
    operator_delete(local_5c0.source._M_dataplus._M_p,
                    local_5c0.source.field_2._M_allocated_capacity + 1);
  }
  if (local_548 != local_538) {
    operator_delete(local_548,local_538[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p,(ulong)(local_640.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668.name._M_dataplus._M_p != &local_668.name.field_2) {
    operator_delete(local_668.name._M_dataplus._M_p,local_668.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,
                    CONCAT17(local_580.field_2._M_local_buf[7],
                             CONCAT16(local_580.field_2._M_local_buf[6],
                                      CONCAT24(local_580.field_2._M_allocated_capacity._4_2_,
                                               local_580.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if (local_618 != (undefined1  [8])&local_608) {
    operator_delete((void *)local_618,local_608._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.m_name._M_dataplus._M_p != &local_518.m_name.field_2) {
    operator_delete(local_518.m_name._M_dataplus._M_p,
                    local_518.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
    operator_delete((void *)local_6a8._0_8_,local_6a8._16_8_ + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)local_308);
  local_188.super_VertexShader._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00d0dbf0;
  local_188.super_GeometryShader._vptr_GeometryShader = (_func_int **)&DAT_00d0dc28;
  local_188.super_FragmentShader._vptr_FragmentShader = (_func_int **)&DAT_00d0dc40;
  local_668.name._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_668.name._M_string_length = 0x3f80000000000000;
  local_6a8._0_8_ = (pointer)0x3f8000003f800000;
  local_6a8._8_8_ = 0x3f80000000000000;
  local_580._M_dataplus._M_p = local_580._M_dataplus._M_p & 0xffffffff00000000;
  local_5a0._M_dataplus._M_p = local_5a0._M_dataplus._M_p & 0xffffffff00000000;
  local_640._M_dataplus._M_p = local_640._M_dataplus._M_p & 0xffffffff00000000;
  local_5c0.source._M_dataplus._M_p = local_5c0.source._M_dataplus._M_p & 0xffffffff00000000;
  uVar6 = (*local_478.super_Context._vptr_Context[0x75])();
  uVar7 = (*local_478.super_Context._vptr_Context[0x59])(&local_478,(ulong)uVar6,"a_position");
  uVar8 = (*local_478.super_Context._vptr_Context[0x59])(&local_478,(ulong)uVar6,"a_offset");
  local_554 = (*local_478.super_Context._vptr_Context[0x59])(&local_478,(ulong)uVar6,"a_color");
  iVar12 = this->m_gridSide;
  local_61c = 2.0 / (float)iVar12;
  local_308._0_8_ = (pointer)0x0;
  stack0xfffffffffffffd00 = (pointer)0x3f80000000000000;
  local_2f8._M_allocated_capacity._4_4_ = 0;
  local_2f8._8_4_ = 0;
  local_2f8._12_4_ = 0x3f800000;
  uStack_2e8 = 0;
  local_2e0 = (pointer)0x3f80000000000000;
  local_2d8._M_allocated_capacity._0_4_ = 0;
  local_2d8._8_8_ = (pointer)0x3f80000000000000;
  iVar13 = 0;
  local_2c4._0_4_ = SNORM_INT8;
  local_2c4._4_4_ = 0;
  local_2bc = 0x3f800000;
  local_2b0 = (pointer)0x3f80000000000000;
  local_688._M_dataplus._M_p = (pointer)0x2000300040000;
  local_688._M_string_length = CONCAT44(local_688._M_string_length._4_4_,0x50001);
  local_518.m_name.field_2._M_allocated_capacity = 0;
  local_518.m_name._M_dataplus._M_p = (char *)0x0;
  local_518.m_name._M_string_length = 0;
  local_55c = uVar7;
  local_558 = uVar8;
  local_550 = uVar6;
  local_2f8._M_allocated_capacity._0_4_ = local_61c;
  fStack_2e4 = local_61c;
  local_2d8._M_allocated_capacity._4_4_ = local_61c;
  local_2c8 = local_61c;
  local_2b8 = local_61c;
  local_2b4 = local_61c;
  if (iVar12 < 1) {
    local_618 = (undefined1  [8])0x0;
    pVStack_610 = (pointer)0x0;
    local_608._M_allocated_capacity = 0;
  }
  else {
    do {
      if (0 < iVar12) {
        local_54c = (float)iVar13 * local_61c + -1.0;
        iVar15 = 0;
        do {
          local_618._4_4_ = (float)iVar15 * local_61c + -1.0;
          local_618._0_4_ = local_54c;
          pVStack_610 = (pointer)0x0;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_518
                     ,(Vector<float,_4> *)local_618);
          iVar15 = iVar15 + 1;
          iVar12 = this->m_gridSide;
        } while (iVar15 < iVar12);
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < iVar12);
    local_618 = (undefined1  [8])0x0;
    pVStack_610 = (pointer)0x0;
    local_608._M_allocated_capacity = 0;
    if (0 < iVar12) {
      iVar13 = 0;
      do {
        if (0 < iVar12) {
          iVar15 = 0;
          do {
            __x = (VertexAttribute *)local_6a8;
            if ((iVar13 + iVar15 & 1U) == 0) {
              __x = &local_668;
            }
            std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_618,(value_type *)__x);
            iVar15 = iVar15 + 1;
            iVar12 = this->m_gridSide;
          } while (iVar15 < iVar12);
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 < iVar12);
    }
  }
  (*local_478.super_Context._vptr_Context[0x26])(&local_478,1,&local_580);
  uVar4 = local_550;
  uVar8 = local_554;
  uVar7 = local_558;
  uVar6 = local_55c;
  (*local_478.super_Context._vptr_Context[0x25])
            (&local_478,0x8892,(ulong)local_580._M_dataplus._M_p & 0xffffffff);
  (*local_478.super_Context._vptr_Context[0x28])(&local_478,0x8892,0x60,local_308,0x88e4);
  (*local_478.super_Context._vptr_Context[0x4e])(&local_478,(ulong)uVar6,4,0x1406,0,0,0);
  (*local_478.super_Context._vptr_Context[0x52])(&local_478,(ulong)uVar6,0);
  (*local_478.super_Context._vptr_Context[0x50])(&local_478,(ulong)uVar6);
  (*local_478.super_Context._vptr_Context[0x26])(&local_478,1,&local_5a0);
  (*local_478.super_Context._vptr_Context[0x25])
            (&local_478,0x8892,(ulong)local_5a0._M_dataplus._M_p & 0xffffffff);
  (*local_478.super_Context._vptr_Context[0x28])
            (&local_478,0x8892,
             local_518.m_name._M_string_length - (long)local_518.m_name._M_dataplus._M_p,
             local_518.m_name._M_dataplus._M_p,0x88e4);
  (*local_478.super_Context._vptr_Context[0x4e])(&local_478,(ulong)uVar7,4,0x1406,0,0,0);
  (*local_478.super_Context._vptr_Context[0x52])(&local_478,(ulong)uVar7,1);
  (*local_478.super_Context._vptr_Context[0x50])(&local_478,(ulong)uVar7);
  (*local_478.super_Context._vptr_Context[0x26])(&local_478,1,&local_640);
  (*local_478.super_Context._vptr_Context[0x25])
            (&local_478,0x8892,(ulong)local_640._M_dataplus._M_p & 0xffffffff);
  (*local_478.super_Context._vptr_Context[0x28])
            (&local_478,0x8892,(long)pVStack_610 - (long)local_618,local_618,0x88e4);
  (*local_478.super_Context._vptr_Context[0x4e])(&local_478,(ulong)uVar8,4,0x1406,0,0,0);
  (*local_478.super_Context._vptr_Context[0x52])(&local_478,(ulong)uVar8,1);
  (*local_478.super_Context._vptr_Context[0x50])(&local_478,(ulong)uVar8);
  if (this->m_useIndices == true) {
    (*local_478.super_Context._vptr_Context[0x26])(&local_478,1,&local_5c0);
    (*local_478.super_Context._vptr_Context[0x25])
              (&local_478,0x8893,(ulong)local_5c0.source._M_dataplus._M_p & 0xffffffff);
    (*local_478.super_Context._vptr_Context[0x28])(&local_478,0x8893,0xc,&local_688,0x88e4);
  }
  (*local_478.super_Context._vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*local_478.super_Context._vptr_Context[0x2d])(&local_478,0x4000);
  (*local_478.super_Context._vptr_Context[5])
            (&local_478,0,0,(ulong)(uint)local_5d8.m_width,(ulong)(uint)local_5d8.m_height);
  (*local_478.super_Context._vptr_Context[0x76])(&local_478,(ulong)uVar4);
  if (this->m_useIndices == true) {
    (*local_478.super_Context._vptr_Context[0x6b])(&local_478,4,6,0x1403,0);
  }
  else {
    (*local_478.super_Context._vptr_Context[0x69])
              (&local_478,4,0,6,(ulong)(uint)(this->m_gridSide * this->m_gridSide));
  }
  (*local_478.super_Context._vptr_Context[0x76])(&local_478,0);
  if (this->m_useIndices == true) {
    (*local_478.super_Context._vptr_Context[0x27])(&local_478,1,&local_5c0);
  }
  (*local_478.super_Context._vptr_Context[0x27])(&local_478,1,&local_640);
  (*local_478.super_Context._vptr_Context[0x27])(&local_478,1,&local_5a0);
  (*local_478.super_Context._vptr_Context[0x27])(&local_478,1,&local_580);
  (*local_478.super_Context._vptr_Context[0x77])(&local_478,(ulong)uVar4);
  (*local_478.super_Context._vptr_Context[0x7a])();
  (*local_478.super_Context._vptr_Context[0x80])
            (&local_478,&local_5d8,0,0,(ulong)(uint)local_5d8.m_width,
             (ulong)(uint)local_5d8.m_height);
  err = (*local_478.super_Context._vptr_Context[0x79])();
  glu::checkError(err,"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDrawTests.cpp"
                  ,0x302);
  if (local_618 != (undefined1  [8])0x0) {
    operator_delete((void *)local_618,local_608._M_allocated_capacity - (long)local_618);
  }
  if (local_518.m_name._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_518.m_name._M_dataplus._M_p,
                    local_518.m_name.field_2._M_allocated_capacity -
                    (long)local_518.m_name._M_dataplus._M_p);
  }
  tcu::Surface::Surface((Surface *)&local_5c0,local_5d8.m_width,local_5d8.m_height);
  if (0 < local_5d8.m_height) {
    iVar12 = 0;
    bVar2 = true;
    do {
      if (0 < local_5d8.m_width) {
        iVar13 = 0;
        do {
          if (((iVar12 == 0 || iVar13 == 0) || (iVar12 + 1U == local_5d8.m_height)) ||
             (iVar13 + 1U == local_5d8.m_width)) {
            *(undefined4 *)
             (local_5c0.source._M_string_length +
             (long)((int)local_5c0.source._M_dataplus._M_p * iVar12 + iVar13) * 4) = 0xff00ff00;
          }
          else {
            uVar6 = *(uint *)((long)local_5d8.m_pixels.m_ptr +
                             (long)(local_5d8.m_width * iVar12 + iVar13) * 4);
            bVar16 = (~(uVar6 >> 8) & 0xff) < 0x15;
            bVar17 = (uVar6 & 0xff0000) < 0x140001;
            uVar14 = 0xff0000ff;
            if (bVar17 && bVar16) {
              uVar14 = 0xff00ff00;
            }
            *(undefined4 *)
             (local_5c0.source._M_string_length +
             (long)((int)local_5c0.source._M_dataplus._M_p * iVar12 + iVar13) * 4) = uVar14;
            bVar2 = (bool)(bVar2 & (bVar17 && bVar16));
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < local_5d8.m_width);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < local_5d8.m_height);
    if (!bVar2) {
      this_02 = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_308 + 8);
      local_308._0_8_ = this_02;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Image verification failed.",0x1a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_290);
      local_668.name._M_dataplus._M_p = (pointer)&local_668.name.field_2;
      local_308._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x12;
      local_668.name._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_668,(ulong)local_308);
      local_668.name.field_2._M_allocated_capacity = local_308._0_8_;
      builtin_strncpy(local_668.name._M_dataplus._M_p,"Verfication result",0x12);
      local_668.name._M_string_length = local_308._0_8_;
      local_668.name._M_dataplus._M_p[local_308._0_8_] = '\0';
      local_6a8._0_8_ = local_6a8 + 0x10;
      local_308._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x13;
      local_6a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_6a8,(ulong)local_308);
      local_6a8._16_8_ = local_308._0_8_;
      builtin_strncpy((char *)local_6a8._0_8_,"Result of rendering",0x13);
      local_6a8._8_8_ = local_308._0_8_;
      *(char *)(local_6a8._0_8_ + local_308._0_8_) = '\0';
      tcu::LogImageSet::LogImageSet((LogImageSet *)local_618,&local_668.name,(string *)local_6a8);
      tcu::TestLog::startImageSet
                ((TestLog *)this_02,(char *)local_618,(char *)CONCAT44(uStack_5f4,local_5f8));
      local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
      local_688._M_string_length = 6;
      local_688.field_2._M_allocated_capacity._0_7_ = 0x746c75736552;
      local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
      local_580.field_2._M_allocated_capacity._0_4_ = 0x75736552;
      local_580.field_2._M_allocated_capacity._4_2_ = 0x746c;
      local_580._M_string_length = 6;
      local_580.field_2._M_local_buf[6] = '\0';
      pSVar11 = &local_5d8;
      tcu::LogImage::LogImage
                ((LogImage *)local_308,&local_688,&local_580,pSVar11,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)local_308,(int)this_02,__buf_00,(size_t)pSVar11);
      local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
      local_5a0.field_2._M_allocated_capacity = 0x73614d726f727245;
      local_5a0.field_2._8_2_ = 0x6b;
      local_5a0._M_string_length = 9;
      local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
      local_640.field_2._M_allocated_capacity = 0x616d20726f727245;
      local_640.field_2._8_2_ = 0x6b73;
      local_640._M_string_length = 10;
      local_640.field_2._M_local_buf[10] = '\0';
      pSVar11 = (Surface *)&local_5c0;
      tcu::LogImage::LogImage
                (&local_518,&local_5a0,&local_640,pSVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_518,(int)this_02,__buf_01,(size_t)pSVar11);
      tcu::TestLog::endImageSet((TestLog *)this_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_518.m_description._M_dataplus._M_p._4_4_,
                      local_518.m_description._M_dataplus._M_p._0_4_) !=
          &local_518.m_description.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_518.m_description._M_dataplus._M_p._4_4_,
                                 local_518.m_description._M_dataplus._M_p._0_4_),
                        local_518.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518.m_name._M_dataplus._M_p != &local_518.m_name.field_2) {
        operator_delete(local_518.m_name._M_dataplus._M_p,
                        local_518.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_640._M_dataplus._M_p != &local_640.field_2) {
        operator_delete(local_640._M_dataplus._M_p,
                        (ulong)(local_640.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
        operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(fStack_2e4,uStack_2e8) != &local_2d8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fStack_2e4,uStack_2e8),
                        CONCAT44(local_2d8._M_allocated_capacity._4_4_,
                                 local_2d8._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._0_8_ != &local_2f8) {
        operator_delete((void *)local_308._0_8_,
                        CONCAT44(local_2f8._M_allocated_capacity._4_4_,
                                 local_2f8._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_580._M_dataplus._M_p != &local_580.field_2) {
        operator_delete(local_580._M_dataplus._M_p,
                        CONCAT17(local_580.field_2._M_local_buf[7],
                                 CONCAT16(local_580.field_2._M_local_buf[6],
                                          CONCAT24(local_580.field_2._M_allocated_capacity._4_2_,
                                                   local_580.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_688._M_dataplus._M_p != &local_688.field_2) {
        operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_5f4,local_5f8) != &local_5e8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_5f4,local_5f8),local_5e8._M_allocated_capacity + 1);
      }
      if (local_618 != (undefined1  [8])&local_608) {
        operator_delete((void *)local_618,(ulong)(local_608._M_allocated_capacity + 1));
      }
      if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
        operator_delete((void *)local_6a8._0_8_,local_6a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_668.name._M_dataplus._M_p != &local_668.name.field_2) {
        operator_delete(local_668.name._M_dataplus._M_p,
                        local_668.name.field_2._M_allocated_capacity + 1);
      }
      tcu::Surface::~Surface((Surface *)&local_5c0);
      description = "Incorrect rendering result";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_00653094;
    }
  }
  this_01 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_618 = (undefined1  [8])&local_608;
  local_308._0_8_ = (pointer)0x12;
  local_618 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_618,(ulong)local_308);
  local_608._M_allocated_capacity = local_308._0_8_;
  *(undefined8 *)local_618 = 0x7461636966726556;
  *(char *)((long)local_618 + 8) = 'i';
  *(char *)((long)local_618 + 9) = 'o';
  *(char *)((long)local_618 + 10) = 'n';
  *(char *)((long)local_618 + 0xb) = ' ';
  *(char *)((long)local_618 + 0xc) = 'r';
  *(char *)((long)local_618 + 0xd) = 'e';
  *(char *)((long)local_618 + 0xe) = 's';
  *(char *)((long)local_618 + 0xf) = 'u';
  *(char *)((long)local_618 + 0x10) = 'l';
  *(char *)((long)local_618 + 0x11) = 't';
  pVStack_610 = (pointer)local_308._0_8_;
  *(char *)((long)local_618 + local_308._0_8_) = '\0';
  local_668.name._M_dataplus._M_p = (pointer)&local_668.name.field_2;
  local_308._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x13;
  local_668.name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_668,(ulong)local_308);
  local_668.name.field_2._M_allocated_capacity = local_308._0_8_;
  builtin_strncpy(local_668.name._M_dataplus._M_p,"Result of rendering",0x13);
  local_668.name._M_string_length = local_308._0_8_;
  local_668.name._M_dataplus._M_p[local_308._0_8_] = '\0';
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_518,(string *)local_618,&local_668.name);
  tcu::TestLog::startImageSet
            (this_01,local_518.m_name._M_dataplus._M_p,
             (char *)CONCAT44(local_518.m_description._M_dataplus._M_p._4_4_,
                              local_518.m_description._M_dataplus._M_p._0_4_));
  local_6a8._0_8_ = local_6a8 + 0x10;
  local_6a8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x6;
  local_6a8._16_7_ = 0x746c75736552;
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  local_688._M_string_length = 6;
  local_688.field_2._M_allocated_capacity._0_7_ = 0x746c75736552;
  pSVar11 = &local_5d8;
  tcu::LogImage::LogImage
            ((LogImage *)local_308,(string *)local_6a8,&local_688,pSVar11,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_308,(int)this_01,__buf,(size_t)pSVar11);
  tcu::TestLog::endImageSet(this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(fStack_2e4,uStack_2e8) != &local_2d8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(fStack_2e4,uStack_2e8),
                    CONCAT44(local_2d8._M_allocated_capacity._4_4_,
                             local_2d8._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._0_8_ != &local_2f8) {
    operator_delete((void *)local_308._0_8_,
                    CONCAT44(local_2f8._M_allocated_capacity._4_4_,
                             local_2f8._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
    operator_delete((void *)local_6a8._0_8_,local_6a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_518.m_description._M_dataplus._M_p._4_4_,
                  local_518.m_description._M_dataplus._M_p._0_4_) !=
      &local_518.m_description.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_518.m_description._M_dataplus._M_p._4_4_,
                             local_518.m_description._M_dataplus._M_p._0_4_),
                    local_518.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.m_name._M_dataplus._M_p != &local_518.m_name.field_2) {
    operator_delete(local_518.m_name._M_dataplus._M_p,
                    local_518.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668.name._M_dataplus._M_p != &local_668.name.field_2) {
    operator_delete(local_668.name._M_dataplus._M_p,local_668.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_618 != (undefined1  [8])&local_608) {
    operator_delete((void *)local_618,(ulong)(local_608._M_allocated_capacity + 1));
  }
  tcu::Surface::~Surface((Surface *)&local_5c0);
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_00653094:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  sglr::ShaderProgram::~ShaderProgram(&local_188);
  tcu::Surface::~Surface(&local_5d8);
  sglr::GLContext::~GLContext(&local_478);
  return STOP;
}

Assistant:

InstancedGridRenderTest::IterateResult InstancedGridRenderTest::iterate (void)
{
	const int renderTargetWidth  = de::min(1024, m_context.getRenderTarget().getWidth());
	const int renderTargetHeight = de::min(1024, m_context.getRenderTarget().getHeight());

	sglr::GLContext ctx		(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS | sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(0, 0, renderTargetWidth, renderTargetHeight));
	tcu::Surface	surface	(renderTargetWidth, renderTargetHeight);
	GridProgram		program;

	// render

	renderTo(ctx, program, surface);

	// verify image

	if (verifyImage(surface))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rendering result");
	return STOP;
}